

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_functions.hpp
# Opt level: O2

void so_5::impl::instantiator_and_sender_base<so_5::stats::messages::work_thread_activity,false>::
     send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,std::thread::id,so_5::stats::work_thread_activity_stats_t>
               (mbox_t *to,prefix_t *args,suffix_t *args_1,id *args_2,
               work_thread_activity_stats_t *args_3)

{
  abstract_message_box_t *this;
  work_thread_activity *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_so_5::stats::messages::work_thread_activity_*,_false> local_18;
  
  this = to->m_obj;
  local_18._M_head_impl = in_RAX;
  details::make_message_instance_impl<false,so_5::stats::messages::work_thread_activity>::
  make<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,std::thread::id,so_5::stats::work_thread_activity_stats_t>
            ((make_message_instance_impl<false,so_5::stats::messages::work_thread_activity> *)
             &local_18,args,args_1,args_2,args_3);
  abstract_message_box_t::deliver_message<so_5::stats::messages::work_thread_activity>
            (this,(type_index)&stats::messages::work_thread_activity::typeinfo,
             (unique_ptr<so_5::stats::messages::work_thread_activity,_std::default_delete<so_5::stats::messages::work_thread_activity>_>
              *)&local_18,immutable_message);
  if (local_18._M_head_impl != (work_thread_activity *)0x0) {
    (*((local_18._M_head_impl)->super_message_t)._vptr_message_t[1])();
  }
  return;
}

Assistant:

void
send( TARGET && to, ARGS&&... args )
	{
		so_5::impl::instantiator_and_sender< MESSAGE >::send(
				send_functions_details::arg_to_mbox( std::forward<TARGET>(to) ),
				std::forward<ARGS>(args)... );
	}